

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.h
# Opt level: O2

bool __thiscall FxExpression::IsObject(FxExpression *this)

{
  bool bVar1;
  
  bVar1 = DObject::IsKindOf((DObject *)this->ValueType,PPointer::RegistrationInfo.MyClass);
  if (bVar1) {
    bVar1 = DObject::IsKindOf((DObject *)this->ValueType,PClassPointer::RegistrationInfo.MyClass);
    if ((!bVar1) && ((PPointer *)this->ValueType != TypeNullPtr)) {
      bVar1 = DObject::IsKindOf((DObject *)((PPointer *)this->ValueType)->PointedType,
                                PClass::RegistrationInfo.MyClass);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool IsObject() const { return ValueType->IsKindOf(RUNTIME_CLASS(PPointer)) && !ValueType->IsKindOf(RUNTIME_CLASS(PClassPointer)) && ValueType != TypeNullPtr && static_cast<PPointer*>(ValueType)->PointedType->IsKindOf(RUNTIME_CLASS(PClass)); }